

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.cpp
# Opt level: O1

string * __thiscall
rapid::Request::user_agent_abi_cxx11_(string *__return_storage_ptr__,Request *this)

{
  _Head_base<0UL,_rapid::Request::Impl_*,_false> _Var1;
  pointer pcVar2;
  mapped_type *pmVar3;
  key_type local_40;
  
  _Var1._M_head_impl =
       (this->_impl)._M_t.
       super___uniq_ptr_impl<rapid::Request::Impl,_std::default_delete<rapid::Request::Impl>_>._M_t.
       super__Tuple_impl<0UL,_rapid::Request::Impl_*,_std::default_delete<rapid::Request::Impl>_>.
       super__Head_base<0UL,_rapid::Request::Impl_*,_false>._M_head_impl;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"USER_AGENT","");
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::at(&(_Var1._M_head_impl)->_environments,&local_40);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (pmVar3->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + pmVar3->_M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Request::user_agent() const {
  try {
    return environments().at("USER_AGENT");
  } catch (std::out_of_range &e) {
    return "";
  }
}